

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O0

EVP_MD * EVP_parse_digest_algorithm(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_50 [8];
  CBS param;
  EVP_MD *ret;
  CBS oid;
  CBS algorithm;
  CBS *cbs_local;
  
  iVar1 = CBS_get_asn1(cbs,(CBS *)&oid.len,0x20000010);
  if ((iVar1 == 0) || (iVar1 = CBS_get_asn1((CBS *)&oid.len,(CBS *)&ret,6), iVar1 == 0)) {
    ERR_put_error(0x1d,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                  ,0x84);
    cbs_local = (CBS *)0x0;
  }
  else {
    param.len = (size_t)cbs_to_md((CBS *)&ret);
    if ((EVP_MD *)param.len == (EVP_MD *)0x0) {
      ERR_put_error(0x1d,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                    ,0x8a);
      cbs_local = (CBS *)0x0;
    }
    else {
      sVar2 = CBS_len((CBS *)&oid.len);
      if ((sVar2 == 0) ||
         (((iVar1 = CBS_get_asn1((CBS *)&oid.len,(CBS *)local_50,5), iVar1 != 0 &&
           (sVar2 = CBS_len((CBS *)local_50), sVar2 == 0)) &&
          (sVar2 = CBS_len((CBS *)&oid.len), sVar2 == 0)))) {
        cbs_local = (CBS *)param.len;
      }
      else {
        ERR_put_error(0x1d,0,0x65,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                      ,0x97);
        cbs_local = (CBS *)0x0;
      }
    }
  }
  return (EVP_MD *)cbs_local;
}

Assistant:

const EVP_MD *EVP_parse_digest_algorithm(CBS *cbs) {
  CBS algorithm, oid;
  if (!CBS_get_asn1(cbs, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&algorithm, &oid, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_DECODE_ERROR);
    return NULL;
  }

  const EVP_MD *ret = cbs_to_md(&oid);
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_UNKNOWN_HASH);
    return NULL;
  }

  // The parameters, if present, must be NULL. Historically, whether the NULL
  // was included or omitted was not well-specified. When parsing an
  // AlgorithmIdentifier, we allow both. (Note this code is not used when
  // verifying RSASSA-PKCS1-v1_5 signatures.)
  if (CBS_len(&algorithm) > 0) {
    CBS param;
    if (!CBS_get_asn1(&algorithm, &param, CBS_ASN1_NULL) ||
        CBS_len(&param) != 0 ||  //
        CBS_len(&algorithm) != 0) {
      OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_DECODE_ERROR);
      return NULL;
    }
  }

  return ret;
}